

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  byte c;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar3 = 0;
  do {
    uVar10 = (this->m_str)._M_string_length;
    if (uVar10 <= uVar3) {
      return;
    }
    pcVar1 = (this->m_str)._M_dataplus._M_p;
    c = pcVar1[uVar3];
    if (c == 0x22) {
      if (this->m_forWhat == ForAttributes) {
        pcVar4 = "&quot;";
        goto LAB_00123008;
      }
      c = 0x22;
LAB_00123042:
      std::operator<<(os,c);
    }
    else {
      if (c == 0x26) {
        pcVar4 = "&amp;";
      }
      else if (c == 0x3e) {
        if (((uVar3 < 3) || (pcVar1[uVar3 - 1] != ']')) || (pcVar1[uVar3 - 2] != ']')) {
          c = 0x3e;
          goto LAB_00123042;
        }
        pcVar4 = "&gt;";
      }
      else {
        if (c != 0x3c) {
          if ((8 < c) && (c != 0x7f && 0x11 < (byte)(c - 0xe))) {
            if (c < 0x7f) goto LAB_00123042;
            if (199 < (byte)(c + 8)) {
              if ((c & 0xe0) == 0xc0) {
                lVar8 = 2;
                uVar2 = 0x1f;
                if (uVar3 + 1 < uVar10) {
LAB_001230bc:
                  uVar5 = (byte)pcVar1[uVar3 + 1] & 0xffffffc0;
                  bVar11 = uVar5 == 0x80;
                  uVar2 = (byte)pcVar1[uVar3 + 1] & 0x3f | (uVar2 & c) << 6;
                  uVar6 = (uint)lVar8;
                  if (2 < uVar6) {
                    bVar11 = ((byte)pcVar1[uVar3 + 2] & 0xffffffc0) == 0x80 && uVar5 == 0x80;
                    uVar2 = (byte)pcVar1[uVar3 + 2] & 0x3f | uVar2 << 6;
                    if (uVar6 != 3) {
                      bVar11 = bVar11 && ((byte)pcVar1[uVar3 + 3] & 0xffffffc0) == 0x80;
                      uVar2 = (byte)pcVar1[uVar3 + 3] & 0x3f | uVar2 << 6;
                    }
                  }
                  if ((((bVar11) && (0x7f < uVar2)) && ((uVar6 < 3 || (0x7ff < uVar2)))) &&
                     ((uVar6 < 4 || 0xf7fe < uVar2 - 0x801 &&
                      (lVar9 = lVar8, uVar10 = uVar3, uVar2 < 0x110000)))) {
                    while (bVar11 = lVar9 != 0, lVar9 = lVar9 + -1, bVar11) {
                      std::operator<<(os,(this->m_str)._M_dataplus._M_p[uVar10]);
                      uVar10 = uVar10 + 1;
                    }
                    uVar3 = (uVar3 + lVar8) - 1;
                  }
                  else {
                    anon_unknown_1::hexEscapeChar(os,c);
                  }
                  goto LAB_00123047;
                }
              }
              else {
                uVar2 = c & 0xfffffff0;
                uVar7 = (ulong)(uVar2 != 0xe0);
                if (uVar7 + uVar3 + 2 < uVar10) {
                  lVar8 = uVar7 + 3;
                  uVar2 = (uint)(uVar2 == 0xe0) * 8 + 7;
                  goto LAB_001230bc;
                }
              }
            }
          }
          anon_unknown_1::hexEscapeChar(os,c);
          goto LAB_00123047;
        }
        pcVar4 = "&lt;";
      }
LAB_00123008:
      std::operator<<(os,pcVar4);
    }
LAB_00123047:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void XmlEncode::encodeTo( std::ostream& os ) const {
        // Apostrophe escaping not necessary if we always use " to write attributes
        // (see: http://www.w3.org/TR/xml/#syntax)

        for( std::size_t idx = 0; idx < m_str.size(); ++ idx ) {
            unsigned char c = m_str[idx];
            switch (c) {
            case '<':   os << "&lt;"; break;
            case '&':   os << "&amp;"; break;

            case '>':
                // See: http://www.w3.org/TR/xml/#syntax
                if (idx > 2 && m_str[idx - 1] == ']' && m_str[idx - 2] == ']')
                    os << "&gt;";
                else
                    os << c;
                break;

            case '\"':
                if (m_forWhat == ForAttributes)
                    os << "&quot;";
                else
                    os << c;
                break;

            default:
                // Check for control characters and invalid utf-8

                // Escape control characters in standard ascii
                // see http://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
                if (c < 0x09 || (c > 0x0D && c < 0x20) || c == 0x7F) {
                    hexEscapeChar(os, c);
                    break;
                }

                // Plain ASCII: Write it to stream
                if (c < 0x7F) {
                    os << c;
                    break;
                }

                // UTF-8 territory
                // Check if the encoding is valid and if it is not, hex escape bytes.
                // Important: We do not check the exact decoded values for validity, only the encoding format
                // First check that this bytes is a valid lead byte:
                // This means that it is not encoded as 1111 1XXX
                // Or as 10XX XXXX
                if (c <  0xC0 ||
                    c >= 0xF8) {
                    hexEscapeChar(os, c);
                    break;
                }

                auto encBytes = trailingBytes(c);
                // Are there enough bytes left to avoid accessing out-of-bounds memory?
                if (idx + encBytes - 1 >= m_str.size()) {
                    hexEscapeChar(os, c);
                    break;
                }
                // The header is valid, check data
                // The next encBytes bytes must together be a valid utf-8
                // This means: bitpattern 10XX XXXX and the extracted value is sane (ish)
                bool valid = true;
                uint32_t value = headerValue(c);
                for (std::size_t n = 1; n < encBytes; ++n) {
                    unsigned char nc = m_str[idx + n];
                    valid &= ((nc & 0xC0) == 0x80);
                    value = (value << 6) | (nc & 0x3F);
                }

                if (
                    // Wrong bit pattern of following bytes
                    (!valid) ||
                    // Overlong encodings
                    (value < 0x80) ||
                    (0x80 <= value && value < 0x800   && encBytes > 2) ||
                    (0x800 < value && value < 0x10000 && encBytes > 3) ||
                    // Encoded value out of range
                    (value >= 0x110000)
                    ) {
                    hexEscapeChar(os, c);
                    break;
                }

                // If we got here, this is in fact a valid(ish) utf-8 sequence
                for (std::size_t n = 0; n < encBytes; ++n) {
                    os << m_str[idx + n];
                }
                idx += encBytes - 1;
                break;
            }
        }
    }